

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void FM_ADPCMAWrite(YM2610 *F2610,int r,int v)

{
  DEV_LOGGER *logger;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ADPCM_CH *pAVar7;
  
  F2610->adpcmreg[r] = v & 0xff;
  bVar2 = (byte)v;
  if (r == 1) {
    F2610->adpcmTL = ~bVar2 & 0x3f;
    lVar6 = 0;
    do {
      uVar3 = (uint)(&F2610->adpcm[0].IL)[lVar6] + (uint)(~bVar2 & 0x3f);
      if (uVar3 < 0x3f) {
        (&F2610->adpcm[0].vol_mul)[lVar6] = (byte)uVar3 & 7 ^ 0xf;
        bVar1 = (char)(uVar3 >> 3) + 1;
      }
      else {
        (&F2610->adpcm[0].vol_mul)[lVar6] = '\0';
        bVar1 = 0;
      }
      (&F2610->adpcm[0].vol_shift)[lVar6] = bVar1;
      *(uint *)((long)&F2610->adpcm[0].adpcm_out + lVar6) =
           (int)(&F2610->adpcm[0].vol_mul)[lVar6] *
           *(int *)((long)&F2610->adpcm[0].adpcm_acc + lVar6) >> (bVar1 & 0x1f) & 0xfffffffc;
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != 0x180);
  }
  else {
    pAVar7 = F2610->adpcm;
    if (r == 0) {
      if ((char)bVar2 < '\0') {
        lVar6 = 0;
        do {
          if (((uint)v >> ((uint)lVar6 & 0x1f) & 1) != 0) {
            pAVar7->flag = '\0';
          }
          lVar6 = lVar6 + 1;
          pAVar7 = pAVar7 + 1;
        } while (lVar6 != 6);
      }
      else {
        logger = &(F2610->OPN).logger;
        lVar6 = 0;
        do {
          if (((uint)v >> ((uint)lVar6 & 0x1f) & 1) != 0) {
            pAVar7->now_addr = pAVar7->start * 2;
            pAVar7->now_step = 0;
            pAVar7->adpcm_acc = 0;
            pAVar7->adpcm_step = 0;
            pAVar7->adpcm_out = 0;
            pAVar7->flag = '\x01';
            if (F2610->pcmbuf == (UINT8 *)0x0) {
              emu_logf(logger,'\x02',"ADPCM-A rom not mapped\n");
            }
            else {
              if (F2610->pcm_size <= pAVar7->end) {
                emu_logf(logger,'\x04',"ADPCM-A end out of range: $%08x\n");
              }
              if (pAVar7->start < F2610->pcm_size) goto LAB_00130cbd;
              emu_logf(logger,'\x04',"ADPCM-A start out of range: $%08x\n");
            }
            pAVar7->flag = '\0';
          }
LAB_00130cbd:
          lVar6 = lVar6 + 1;
          pAVar7 = pAVar7 + 1;
        } while (lVar6 != 6);
      }
    }
    else {
      uVar3 = r & 7;
      if (uVar3 < 6) {
        bVar1 = (byte)r & 7;
        uVar4 = (r & 0x38U) - 8;
        uVar5 = uVar4 >> 3;
        if (uVar5 - 1 < 2) {
          F2610->adpcm[bVar1].start =
               F2610->adpcmreg[(ulong)uVar3 + 0x10] << 8 |
               F2610->adpcmreg[(ulong)uVar3 + 0x18] << 0x10;
        }
        else if (uVar5 - 3 < 2) {
          F2610->adpcm[bVar1].end =
               F2610->adpcmreg[(ulong)uVar3 + 0x20] << 8 |
               F2610->adpcmreg[(ulong)uVar3 + 0x28] << 0x10 | 0xff;
        }
        else if (uVar4 == 0) {
          F2610->adpcm[bVar1].IL = ~bVar2 & 0x1f;
          uVar3 = (uint)(~bVar2 & 0x1f) + (uint)F2610->adpcmTL;
          if (uVar3 < 0x3f) {
            pAVar7[bVar1].vol_mul = (byte)uVar3 & 7 ^ 0xf;
            bVar2 = (char)(uVar3 >> 3) + 1;
          }
          else {
            pAVar7[bVar1].vol_mul = '\0';
            bVar2 = 0;
          }
          pAVar7[bVar1].vol_shift = bVar2;
          pAVar7[bVar1].pan = (INT32 *)((long)(F2610->OPN).out_adpcm + (ulong)((uint)v >> 4 & 0xc));
          pAVar7[bVar1].adpcm_out =
               (int)pAVar7[bVar1].vol_mul * pAVar7[bVar1].adpcm_acc >> (bVar2 & 0x1f) & 0xfffffffc;
        }
      }
    }
  }
  return;
}

Assistant:

static void FM_ADPCMAWrite(YM2610 *F2610,int r,int v)
{
	ADPCM_CH *adpcm = F2610->adpcm;
	UINT8 c = r&0x07;

	F2610->adpcmreg[r] = v&0xff; /* stock data */
	switch( r )
	{
	case 0x00: /* DM,--,C5,C4,C3,C2,C1,C0 */
		if( !(v&0x80) )
		{
			/* KEY ON */
			for( c = 0; c < 6; c++ )
			{
				if( (v>>c)&1 )
				{
					/**** start adpcm ****/
					// The .step variable is already set and for the YM2608 it is different on channels 4 and 5.
					//adpcm[c].step      = (UINT32)((float)(1<<ADPCM_SHIFT)*((float)F2610->OPN.ST.freqbase)/3.0);
					adpcm[c].now_addr  = adpcm[c].start<<1;
					adpcm[c].now_step  = 0;
					adpcm[c].adpcm_acc = 0;
					adpcm[c].adpcm_step= 0;
					adpcm[c].adpcm_out = 0;
					adpcm[c].flag      = 1;

					if(F2610->pcmbuf==NULL)
					{                   /* Check ROM Mapped */
						emu_logf(&F2610->OPN.logger, DEVLOG_WARN, "ADPCM-A rom not mapped\n");
						adpcm[c].flag = 0;
					}
					else
					{
						if(adpcm[c].end >= F2610->pcm_size)
						{   /* Check End in Range */
							emu_logf(&F2610->OPN.logger, DEVLOG_DEBUG, "ADPCM-A end out of range: $%08x\n",adpcm[c].end);
							/*adpcm[c].end = F2610->pcm_size-1;*/ /* JB: DO NOT uncomment this, otherwise you will break the comparison in the ADPCM_CALC_CHA() */
						}
						if(adpcm[c].start >= F2610->pcm_size)   /* Check Start in Range */
						{
							emu_logf(&F2610->OPN.logger, DEVLOG_DEBUG, "ADPCM-A start out of range: $%08x\n",adpcm[c].start);
							adpcm[c].flag = 0;
						}
					}
				}
			}
		}
		else
		{
			/* KEY OFF */
			for( c = 0; c < 6; c++ )
				if( (v>>c)&1 )
					adpcm[c].flag = 0;
		}
		break;
	case 0x01:  /* B0-5 = TL */
		F2610->adpcmTL = (v & 0x3f) ^ 0x3f;
		for( c = 0; c < 6; c++ )
		{
			int volume = F2610->adpcmTL + adpcm[c].IL;

			if ( volume >= 63 ) /* This is correct, 63 = quiet */
			{
				adpcm[c].vol_mul   = 0;
				adpcm[c].vol_shift = 0;
			}
			else
			{
				adpcm[c].vol_mul   = 15 - (volume & 7);     /* so called 0.75 dB */
				adpcm[c].vol_shift =  1 + (volume >> 3);    /* Yamaha engineers used the approximation: each -6 dB is close to divide by two (shift right) */
			}

			/* calc pcm * volume data */
			adpcm[c].adpcm_out = ((adpcm[c].adpcm_acc * adpcm[c].vol_mul) >> adpcm[c].vol_shift) & ~3;  /* multiply, shift and mask out low 2 bits */
		}
		break;
	default:
		c = r&0x07;
		if( c >= 0x06 ) return;
		switch( r&0x38 )
		{
		case 0x08:  /* B7=L,B6=R, B4-0=IL */
		{
			int volume;

			adpcm[c].IL = (v & 0x1f) ^ 0x1f;

			volume = F2610->adpcmTL + adpcm[c].IL;

			if ( volume >= 63 ) /* This is correct, 63 = quiet */
			{
				adpcm[c].vol_mul   = 0;
				adpcm[c].vol_shift = 0;
			}
			else
			{
				adpcm[c].vol_mul   = 15 - (volume & 7);     /* so called 0.75 dB */
				adpcm[c].vol_shift =  1 + (volume >> 3);    /* Yamaha engineers used the approximation: each -6 dB is close to divide by two (shift right) */
			}

			adpcm[c].pan    = &F2610->OPN.out_adpcm[(v>>6)&0x03];

			/* calc pcm * volume data */
			adpcm[c].adpcm_out = ((adpcm[c].adpcm_acc * adpcm[c].vol_mul) >> adpcm[c].vol_shift) & ~3;  /* multiply, shift and mask out low 2 bits */
		}
			break;
		case 0x10:
		case 0x18:
			adpcm[c].start  = ( (F2610->adpcmreg[0x18 + c]*0x0100 | F2610->adpcmreg[0x10 + c]) << ADPCMA_ADDRESS_SHIFT);
			break;
		case 0x20:
		case 0x28:
			adpcm[c].end    = ( (F2610->adpcmreg[0x28 + c]*0x0100 | F2610->adpcmreg[0x20 + c]) << ADPCMA_ADDRESS_SHIFT);
			adpcm[c].end   += (1<<ADPCMA_ADDRESS_SHIFT) - 1;
			break;
		}
	}
}